

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,FSoundID *sid,FSoundID *def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  int iVar4;
  Value *this;
  Ch *cc;
  char *pcVar5;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if ((uVar1 >> 10 & 1) == 0) {
        if (uVar1 != 0) {
          __assert_fail("val->IsString() || val->IsNull()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x6f2,
                        "FSerializer &Serialize(FSerializer &, const char *, FSoundID &, FSoundID *)"
                       );
        }
        pcVar5 = (char *)0x0;
      }
      else {
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        pcVar5 = UnicodeToString(cc);
      }
      iVar4 = S_FindSound(pcVar5);
      sid->ID = iVar4;
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 == 0) || (def == (FSoundID *)0x0)) ||
        ((pFVar3->mInObject).Array[uVar2 - 1] == false)) || (sid->ID != def->ID)) {
      FSerializer::WriteKey(arc,key);
      if (((long)sid->ID == 0) || (pcVar5 = S_sfx.Array[sid->ID].name.Chars, pcVar5 == (char *)0x0))
      {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::String(arc->w,pcVar5);
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSoundID &sid, FSoundID *def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || sid != *def)
		{
			arc.WriteKey(key);
			const char *sn = (const char*)sid;
			if (sn != nullptr) arc.w->String(sn);
			else arc.w->Null();
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsString() || val->IsNull());
			if (val->IsString())
			{
				sid = UnicodeToString(val->GetString());
			}
			else if (val->IsNull())
			{
				sid = 0;
			}
			else
			{
				Printf(TEXTCOLOR_RED "string type expected for '%s'", key);
				sid = 0;
				arc.mErrors++;
			}
		}
	}
	return arc;

}